

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O0

void __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
expect<soul::TokenType>
          (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           *this,TokenType expected)

{
  bool bVar1;
  TokenType *in_RCX;
  CompileMessage local_58;
  char *local_20;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
  *local_18;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
  *this_local;
  TokenType expected_local;
  
  local_20 = expected.text;
  local_18 = this;
  this_local = (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                *)expected.text;
  bVar1 = matchIf<soul::TokenType>(this,expected);
  if (!bVar1) {
    Errors::foundWhenExpecting<soul::TokenType&,soul::TokenType&>
              (&local_58,(Errors *)&this->currentType,(TokenType *)&this_local,in_RCX);
    (*this->_vptr_Tokeniser[2])(this,&local_58);
    CompileMessage::~CompileMessage(&local_58);
  }
  return;
}

Assistant:

void expect (Type expected)
    {
        if (! matchIf (expected))
            throwError (Errors::foundWhenExpecting (currentType, expected));
    }